

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

int __thiscall
flow::CastInstr::clone(CastInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LiteralType resultType;
  Value *op;
  CastInstr *this_00;
  
  resultType = *(LiteralType *)(__fn + 8);
  op = (Value *)**(undefined8 **)(__fn + 0x50);
  this_00 = (CastInstr *)operator_new(0x68);
  CastInstr(this_00,resultType,op,(string *)(__fn + 0x10));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> CastInstr::clone() {
  return std::make_unique<CastInstr>(type(), source(), name());
}